

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConditionalPredicateSyntax *args;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxNode *args_3;
  SyntaxNode *args_5;
  ConditionalExpressionSyntax *pCVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_51;
  Token local_50;
  Token local_40;
  
  args = (ConditionalPredicateSyntax *)
         detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_40,
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x30),
                      (BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x68),(DeepCloneVisitor *)&local_50,
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  args_5 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x80),&local_51,(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalExpressionSyntax,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,args,&local_40,args_2,
                      (ExpressionSyntax *)args_3,&local_50,(ExpressionSyntax *)args_5);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalExpressionSyntax>(
        *deepClone<ConditionalPredicateSyntax>(*node.predicate, alloc),
        node.question.deepClone(alloc),
        *deepClone(node.attributes, alloc),
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.colon.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc)
    );
}